

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_dbpointer(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *****pppppcVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  char *__needle;
  void *pvVar10;
  void *pvVar11;
  undefined8 extraout_RAX;
  void *pvVar12;
  undefined8 extraout_RAX_00;
  undefined1 *__n;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined8 extraout_RAX_01;
  void *__s2;
  undefined1 *puVar15;
  undefined8 extraout_RAX_02;
  int *__haystack;
  undefined8 extraout_RAX_03;
  long *plVar16;
  undefined8 extraout_RAX_04;
  undefined8 uVar17;
  undefined8 uVar18;
  char *pcVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  char *unaff_R12;
  undefined **ppuVar23;
  char *pcVar24;
  undefined **ppuVar25;
  undefined **ppuVar26;
  long lVar27;
  char *****pppppcVar28;
  char *****pppppcVar29;
  int *piVar30;
  int *piVar31;
  double dVar32;
  int extraout_XMM0_Db;
  bson_t b;
  bson_error_t error;
  code **ppcVar33;
  undefined4 uStack_635c;
  undefined8 uStack_6358;
  undefined2 uStack_6350;
  int iStack_6348;
  int iStack_6344;
  char acStack_6340 [504];
  code *pcStack_6148;
  undefined1 auStack_6138 [512];
  char *pcStack_5f38;
  code *pcStack_5f30;
  int iStack_5f20;
  int iStack_5f1c;
  char acStack_5f18 [504];
  long *plStack_5d20;
  char *pcStack_5d18;
  char *pcStack_5d10;
  undefined **ppuStack_5d08;
  long lStack_5c90;
  long lStack_5c88;
  undefined1 auStack_5c80 [128];
  undefined1 auStack_5c00 [232];
  undefined1 auStack_5b18 [608];
  long *plStack_58b8;
  code *pcStack_58b0;
  undefined1 auStack_58a8 [8];
  char acStack_58a0 [16];
  char *pcStack_5890;
  code *pcStack_5888;
  uint uStack_5804;
  undefined8 uStack_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 uStack_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 uStack_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 uStack_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined1 auStack_5738 [648];
  int *piStack_54b0;
  char *pcStack_54a8;
  undefined **ppuStack_54a0;
  undefined1 *puStack_5498;
  undefined **ppuStack_5490;
  code *pcStack_5488;
  undefined1 auStack_5480 [240];
  undefined1 auStack_5390 [648];
  code *apcStack_5108 [16];
  undefined *puStack_5088;
  undefined1 auStack_5080 [200];
  int iStack_4fb8;
  int iStack_4fb4;
  int aiStack_4fb0 [160];
  int *piStack_4d30;
  double *pdStack_4d28;
  undefined **ppuStack_4d20;
  int *piStack_4d18;
  int *piStack_4d10;
  code *apcStack_4d08 [16];
  double dStack_4c88;
  int aiStack_4c80 [50];
  int iStack_4bb8;
  int iStack_4bb4;
  int aiStack_4bb0 [160];
  undefined8 uStack_4930;
  undefined1 *puStack_4928;
  char *pcStack_4920;
  char *pcStack_4918;
  undefined **ppuStack_4910;
  code *pcStack_4908;
  int iStack_4900;
  int iStack_48fc;
  char acStack_48f8 [504];
  undefined1 auStack_4700 [336];
  char *pcStack_45b0;
  undefined1 *puStack_45a8;
  undefined1 *puStack_45a0;
  void *pvStack_4598;
  void *pvStack_4590;
  code *pcStack_4588;
  undefined1 auStack_4580 [128];
  char acStack_4500 [232];
  undefined1 auStack_4418 [648];
  char *pcStack_4190;
  code *pcStack_4188;
  undefined1 auStack_4180 [128];
  char acStack_4100 [224];
  int iStack_4020;
  int iStack_401c;
  char acStack_4018 [640];
  char *pcStack_3d98;
  void *pvStack_3d90;
  code *pcStack_3d88;
  undefined1 auStack_3d80 [128];
  char acStack_3d00 [232];
  undefined1 auStack_3c18 [648];
  char *pcStack_3990;
  code *pcStack_3988;
  undefined1 auStack_3980 [232];
  int iStack_3898;
  int iStack_3894;
  char acStack_3890 [640];
  char *pcStack_3610;
  code *apcStack_3608 [16];
  uint uStack_3584;
  undefined1 auStack_3580 [4];
  uint uStack_357c;
  undefined1 auStack_34b8 [648];
  undefined1 *puStack_3230;
  undefined1 *puStack_3228;
  undefined1 *puStack_3220;
  void *pvStack_3218;
  void *pvStack_3210;
  code *pcStack_3208;
  uint uStack_31fc;
  void *pvStack_31f8;
  char *pcStack_31f0;
  void *pvStack_31e8;
  char *pcStack_31e0;
  void *pvStack_31d8;
  char *pcStack_31d0;
  undefined1 *puStack_31c8;
  char *pcStack_31c0;
  undefined1 *puStack_31b8;
  char *pcStack_31b0;
  undefined8 uStack_31a8;
  char *pcStack_31a0;
  undefined8 uStack_3198;
  char *pcStack_3190;
  undefined8 uStack_3188;
  undefined1 auStack_3180 [4];
  uint uStack_317c;
  undefined1 auStack_30b8 [592];
  undefined8 uStack_2e68;
  char *pcStack_2e60;
  char *pcStack_2e58;
  char *pcStack_2e50;
  char *pcStack_2e48;
  char *pcStack_2e40;
  char *pcStack_2e38;
  char *pcStack_2e30;
  char *pcStack_2e28;
  char *pcStack_2e20;
  char *pcStack_2e18;
  char *pcStack_2e10;
  code *apcStack_2e08 [7];
  undefined8 uStack_2dd0;
  void *pvStack_2dc8;
  char *pcStack_2dc0;
  void *pvStack_2db8;
  char *pcStack_2db0;
  undefined8 uStack_2da8;
  char *pcStack_2da0;
  void *pvStack_2d98;
  char *pcStack_2d90;
  undefined8 uStack_2d88;
  char acStack_2d80 [4];
  uint uStack_2d7c;
  undefined1 auStack_2cb8 [648];
  undefined **ppuStack_2a30;
  char *pcStack_2a28;
  long lStack_2a20;
  undefined1 *puStack_2a18;
  undefined1 *puStack_2a10;
  code *pcStack_2a08;
  int iStack_2a00;
  int iStack_29fc;
  char acStack_29f8 [504];
  undefined1 auStack_2800 [168];
  undefined8 uStack_2758;
  long lStack_2750;
  undefined8 uStack_2748;
  undefined8 uStack_2740;
  char *pcStack_2738;
  char *pcStack_2730;
  char *pcStack_2728;
  char *pcStack_2720;
  char *pcStack_2718;
  long lStack_2710;
  undefined8 uStack_2708;
  char *pcStack_2700;
  char *pcStack_26f8;
  char *pcStack_26f0;
  char *pcStack_26e8;
  long lStack_26e0;
  char *pcStack_26d8;
  char *pcStack_26d0;
  char *pcStack_26c8;
  char *pcStack_26c0;
  char *pcStack_26b8;
  char *pcStack_26b0;
  char *pcStack_26a8;
  char *pcStack_26a0;
  char *pcStack_2698;
  char *pcStack_2690;
  code *apcStack_2688 [12];
  undefined8 uStack_2628;
  char *pcStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 uStack_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 uStack_25c0;
  undefined8 uStack_25b8;
  char *apcStack_25b0 [22];
  char acStack_2500 [4];
  uint uStack_24fc;
  undefined1 auStack_2438 [648];
  char *pcStack_21b0;
  undefined **ppuStack_21a8;
  int **ppiStack_21a0;
  char *pcStack_2198;
  int *piStack_2190;
  code *pcStack_2188;
  undefined1 auStack_2180 [128];
  undefined1 auStack_2100 [240];
  undefined1 auStack_2010 [648];
  code *pcStack_1d88;
  undefined1 auStack_1d80 [128];
  char acStack_1d00 [232];
  int iStack_1c18;
  int iStack_1c14;
  char acStack_1c10 [632];
  char *pcStack_1998;
  code *apcStack_1990 [2];
  int iStack_1980;
  int iStack_197c;
  undefined8 uStack_17a8;
  char *pcStack_17a0;
  undefined8 uStack_1798;
  int *piStack_1790;
  code *pcStack_1788;
  int iStack_1704;
  int aiStack_1700 [46];
  undefined8 uStack_1648;
  int *piStack_1640;
  char acStack_1634 [12];
  undefined1 auStack_1628 [648];
  char *pcStack_13a0;
  char *pcStack_1398;
  int *piStack_1390;
  code *apcStack_1388 [15];
  int iStack_1310;
  int iStack_130c;
  int *piStack_1308;
  char acStack_1300 [200];
  undefined1 auStack_1238 [648];
  char ****ppppcStack_fb0;
  char *pcStack_fa8;
  undefined **ppuStack_fa0;
  char ****ppppcStack_f98;
  int *piStack_f90;
  code *apcStack_f88 [14];
  int iStack_f14;
  char ****ppppcStack_f10;
  int iStack_f04;
  char ***apppcStack_f00 [26];
  int iStack_e30;
  int iStack_e2c;
  char ***apppcStack_e28 [80];
  char ****ppppcStack_ba8;
  char *pcStack_ba0;
  char ****ppppcStack_b98;
  int *piStack_b90;
  code *pcStack_b88;
  undefined8 uStack_b80;
  char ****ppppcStack_b10;
  undefined1 auStack_b08 [8];
  char ***apppcStack_b00 [28];
  undefined1 auStack_a20 [648];
  char ****ppppcStack_798;
  undefined1 *puStack_790;
  code *pcStack_788;
  undefined8 uStack_780;
  char *pcStack_710;
  char ****ppppcStack_708;
  char ***apppcStack_700 [29];
  int iStack_618;
  int iStack_614;
  char ***apppcStack_610 [80];
  char ****ppppcStack_390;
  code *pcStack_388;
  char ***apppcStack_380 [25];
  int local_2b8;
  int local_2b4;
  char ***local_2b0 [80];
  
  pppppcVar29 = (char *****)apppcStack_380;
  pcVar19 = "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}";
  ppuVar26 = &PTR_anon_var_dwarf_1a58e_00163210;
  pppppcVar6 = (char *****)local_2b0;
  piVar30 = &local_2b8;
  do {
    pcStack_388 = (code *)0x130e7f;
    cVar1 = bson_init_from_json(apppcStack_380,pcVar19,0xffffffffffffffff,piVar30);
    if (cVar1 != '\0') {
      pcStack_388 = (code *)0x130ed8;
      test_bson_json_read_dbpointer_cold_3();
LAB_00130ed8:
      pcStack_388 = (code *)0x130edd;
      test_bson_json_read_dbpointer_cold_2();
LAB_00130edd:
      pcStack_388 = (code *)0x130efb;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",pppppcVar6,
              unaff_R12);
      pcStack_388 = (code *)0x130f00;
      abort();
    }
    if (local_2b8 != 1) {
      pcStack_388 = test_bson_json_read_legacy_regex;
      test_bson_json_read_dbpointer_cold_1();
      pcStack_788 = (code *)0x130f38;
      ppppcStack_390 = (char ****)pppppcVar6;
      pcStack_388 = (code *)&stack0xfffffffffffffff8;
      cVar1 = bson_init_from_json(apppcStack_700,
                                  "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                                  0xffffffffffffffff,&iStack_618);
      if (cVar1 == '\0') {
LAB_001310ab:
        pcStack_788 = (code *)0x1310b8;
        test_bson_json_read_legacy_regex_cold_1();
LAB_001310b8:
        pcStack_788 = (code *)0x1310bd;
        test_bson_json_read_legacy_regex_cold_4();
LAB_001310bd:
        pcStack_788 = (code *)0x1310c2;
        test_bson_json_read_legacy_regex_cold_5();
LAB_001310c2:
        pcStack_788 = (code *)0x1310ca;
        test_bson_json_read_legacy_regex_cold_10();
LAB_001310ca:
        pcStack_788 = (code *)0x1310cf;
        test_bson_json_read_legacy_regex_cold_6();
LAB_001310cf:
        pcStack_788 = (code *)0x1310d4;
        test_bson_json_read_legacy_regex_cold_7();
LAB_001310d4:
        pcStack_788 = (code *)0x1310dc;
        test_bson_json_read_legacy_regex_cold_8();
      }
      else {
        pcStack_788 = (code *)0x130f45;
        uVar5 = bson_bcone_magic();
        uStack_780 = 0;
        pcStack_788 = (code *)0x130f78;
        bcon_extract(apppcStack_700,"a",uVar5,10,&ppppcStack_708,&pcStack_710);
        pppppcVar6 = (char *****)ppppcStack_708;
        if ((char *****)ppppcStack_708 == (char *****)0x143a90) {
LAB_00130f9e:
          if ((pcStack_710 != "ix") &&
             (((*pcStack_710 != 'i' || (pcStack_710[1] != 'x')) || (pcStack_710[2] != '\0')))) {
LAB_001310a6:
            pcStack_788 = (code *)0x1310ab;
            test_bson_json_read_legacy_regex_cold_3();
            goto LAB_001310ab;
          }
          pppppcVar6 = (char *****)apppcStack_700;
          pcStack_788 = (code *)0x130fdc;
          bson_destroy(pppppcVar6);
          pcStack_788 = (code *)0x130ffa;
          cVar1 = bson_init_from_json(pppppcVar6,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff
                                      ,&iStack_618);
          if (cVar1 != '\0') {
            pcStack_788 = (code *)0x1310a1;
            test_bson_json_read_legacy_regex_cold_11();
LAB_001310a1:
            pcStack_788 = (code *)0x1310a6;
            test_bson_json_read_legacy_regex_cold_9();
            goto LAB_001310a6;
          }
          if (iStack_618 != 1) goto LAB_001310b8;
          if (iStack_614 != 2) goto LAB_001310bd;
          pppppcVar6 = (char *****)apppcStack_610;
          pcStack_788 = (code *)0x131039;
          pcVar19 = strstr((char *)pppppcVar6,"Missing \"$options\" after \"$regex\"");
          if (pcVar19 == (char *)0x0) goto LAB_001310c2;
          pcStack_788 = (code *)0x131065;
          cVar1 = bson_init_from_json(apppcStack_700,"{\"a\": {\"$options\": \"ix\"}}",
                                      0xffffffffffffffff,&iStack_618);
          if (cVar1 != '\0') goto LAB_001310a1;
          if (iStack_618 != 1) goto LAB_001310ca;
          if (iStack_614 != 2) goto LAB_001310cf;
          pcStack_788 = (code *)0x131090;
          pcVar19 = strstr((char *)pppppcVar6,"Missing \"$regex\" after \"$options\"");
          if (pcVar19 != (char *)0x0) {
            return;
          }
          goto LAB_001310d4;
        }
        pcStack_788 = (code *)0x130f96;
        iVar2 = strcmp((char *)ppppcStack_708,"abc");
        if (iVar2 == 0) goto LAB_00130f9e;
      }
      pcStack_788 = test_bson_json_read_regex_options_order;
      test_bson_json_read_legacy_regex_cold_2();
      pcStack_b88 = (code *)0x131119;
      ppppcStack_798 = (char ****)pppppcVar6;
      puStack_790 = (undefined1 *)apppcStack_380;
      pcStack_788 = (code *)&pcStack_388;
      cVar1 = bson_init_from_json(apppcStack_b00,
                                  "{\"a\": {\"$regex\": \"\", \"$options\": \"ism\"}}",
                                  0xffffffffffffffff,auStack_a20);
      if (cVar1 == '\0') {
        pcStack_b88 = (code *)0x13122c;
        test_bson_json_read_regex_options_order_cold_1();
LAB_0013122c:
        pcStack_b88 = (code *)0x131239;
        test_bson_json_read_regex_options_order_cold_3();
LAB_00131239:
        pcStack_b88 = (code *)0x131241;
        test_bson_json_read_regex_options_order_cold_2();
      }
      else {
        pcStack_b88 = (code *)0x131126;
        pppppcVar6 = (char *****)bson_bcone_magic();
        uStack_b80 = 0;
        pcStack_b88 = (code *)0x13115c;
        bcon_extract(apppcStack_b00,"a",pppppcVar6,10,auStack_b08,&ppppcStack_b10);
        pppppcVar29 = (char *****)ppppcStack_b10;
        if (ppppcStack_b10 != (char ****)"ims") {
          pcStack_b88 = (code *)0x13117a;
          iVar2 = strcmp((char *)ppppcStack_b10,"ims");
          if (iVar2 == 0) goto LAB_00131182;
          goto LAB_00131239;
        }
LAB_00131182:
        pppppcVar29 = (char *****)apppcStack_b00;
        pcStack_b88 = (code *)0x131192;
        bson_destroy(pppppcVar29);
        pcStack_b88 = (code *)0x1311b0;
        cVar1 = bson_init_from_json(pppppcVar29,
                                    "{\"a\": {\"$regex\": \"\", \"$options\": \"misl\"}}",
                                    0xffffffffffffffff,auStack_a20);
        if (cVar1 == '\0') goto LAB_0013122c;
        uStack_b80 = 0;
        pppppcVar29 = &ppppcStack_b10;
        pcStack_b88 = (code *)0x1311e7;
        bcon_extract(apppcStack_b00,"a",pppppcVar6,10,auStack_b08,pppppcVar29);
        if (ppppcStack_b10 == (char ****)"ilms") {
LAB_00131209:
          pcStack_b88 = (code *)0x131216;
          bson_destroy(apppcStack_b00);
          return;
        }
        pcStack_b88 = (code *)0x131205;
        iVar2 = strcmp((char *)ppppcStack_b10,"ilms");
        pppppcVar6 = (char *****)ppppcStack_b10;
        if (iVar2 == 0) goto LAB_00131209;
      }
      pcStack_b88 = test_bson_json_read_binary;
      test_bson_json_read_regex_options_order_cold_4();
      apcStack_f88[0] = (code *)0x131282;
      ppppcStack_ba8 = (char ****)pppppcVar6;
      pcStack_ba0 = unaff_R12;
      ppppcStack_b98 = (char ****)pppppcVar29;
      piStack_b90 = piVar30;
      pcStack_b88 = (code *)&pcStack_788;
      cVar1 = bson_init_from_json(apppcStack_f00,
                                  "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\", \"subType\": \"05\"}}}"
                                  ,0xffffffffffffffff,&iStack_e30);
      if (cVar1 == '\0') {
LAB_0013148e:
        apcStack_f88[0] = (code *)0x13149b;
        test_bson_json_read_binary_cold_1();
        pppppcVar28 = pppppcVar29;
LAB_0013149b:
        apcStack_f88[0] = (code *)0x1314a0;
        test_bson_json_read_binary_cold_2();
LAB_001314a0:
        pppppcVar29 = pppppcVar28;
        apcStack_f88[0] = (code *)0x1314a5;
        test_bson_json_read_binary_cold_3();
LAB_001314a5:
        apcStack_f88[0] = (code *)0x1314b2;
        test_bson_json_read_binary_cold_5();
LAB_001314b2:
        apcStack_f88[0] = (code *)0x1314b7;
        test_bson_json_read_binary_cold_6();
LAB_001314b7:
        apcStack_f88[0] = (code *)0x1314bc;
        test_bson_json_read_binary_cold_7();
LAB_001314bc:
        apcStack_f88[0] = (code *)0x1314c1;
        test_bson_json_read_binary_cold_9();
LAB_001314c1:
        apcStack_f88[0] = (code *)0x1314c6;
        test_bson_json_read_binary_cold_10();
LAB_001314c6:
        apcStack_f88[0] = (code *)0x1314ce;
        test_bson_json_read_binary_cold_15();
LAB_001314ce:
        apcStack_f88[0] = (code *)0x1314d3;
        test_bson_json_read_binary_cold_11();
LAB_001314d3:
        apcStack_f88[0] = (code *)0x1314d8;
        test_bson_json_read_binary_cold_12();
LAB_001314d8:
        apcStack_f88[0] = (code *)0x1314e0;
        test_bson_json_read_binary_cold_13();
LAB_001314e0:
        apcStack_f88[0] = (code *)0x1314e8;
        test_bson_json_read_binary_cold_4();
      }
      else {
        apcStack_f88[0] = (code *)0x13128f;
        pppppcVar6 = (char *****)bson_bcone_magic();
        piVar30 = &iStack_f14;
        apcStack_f88[0] = (code *)0x0;
        ppppcStack_f98 = (char ****)0x1312c6;
        piStack_f90 = piVar30;
        bcon_extract(apppcStack_f00,"b",pppppcVar6,4,&iStack_f04,&ppppcStack_f10);
        pppppcVar29 = (char *****)ppppcStack_f10;
        pppppcVar28 = (char *****)&iStack_f04;
        if (iStack_f04 != 5) goto LAB_0013149b;
        if (iStack_f14 != 3) goto LAB_001314a0;
        unaff_R12 = "foo";
        if (ppppcStack_f10 != (char ****)"foo") {
          apcStack_f88[0] = (code *)0x131303;
          iVar2 = strcmp((char *)ppppcStack_f10,"foo");
          if (iVar2 == 0) goto LAB_0013130b;
          goto LAB_001314e0;
        }
LAB_0013130b:
        pppppcVar29 = (char *****)apppcStack_f00;
        apcStack_f88[0] = (code *)0x13131b;
        bson_destroy(pppppcVar29);
        apcStack_f88[0] = (code *)0x131339;
        cVar1 = bson_init_from_json(pppppcVar29,
                                    "{\"b\": {\"$binary\": {\"subType\": \"05\", \"base64\": \"Zm9v\"}}}"
                                    ,0xffffffffffffffff,&iStack_e30);
        if (cVar1 == '\0') goto LAB_001314a5;
        pppppcVar29 = (char *****)&iStack_f04;
        apcStack_f88[0] = (code *)0x0;
        ppppcStack_f98 = (char ****)0x131370;
        piStack_f90 = piVar30;
        bcon_extract(apppcStack_f00,"b",pppppcVar6,4,pppppcVar29,&ppppcStack_f10);
        if (iStack_f04 != 5) goto LAB_001314b2;
        if (iStack_f14 != 3) goto LAB_001314b7;
        if (ppppcStack_f10 == (char ****)"foo") {
LAB_001313ae:
          pppppcVar6 = (char *****)apppcStack_f00;
          apcStack_f88[0] = (code *)0x1313be;
          bson_destroy(pppppcVar6);
          apcStack_f88[0] = (code *)0x1313dc;
          cVar1 = bson_init_from_json(pppppcVar6,"{\"b\": {\"$binary\": {\"subType\": \"5\"}}}",
                                      0xffffffffffffffff,&iStack_e30);
          if (cVar1 != '\0') {
            apcStack_f88[0] = (code *)0x131489;
            test_bson_json_read_binary_cold_16();
LAB_00131489:
            apcStack_f88[0] = (code *)0x13148e;
            test_bson_json_read_binary_cold_14();
            goto LAB_0013148e;
          }
          if (iStack_e30 != 1) goto LAB_001314bc;
          if (iStack_e2c != 2) goto LAB_001314c1;
          pppppcVar6 = (char *****)apppcStack_e28;
          apcStack_f88[0] = (code *)0x13141b;
          pcVar19 = strstr((char *)pppppcVar6,"Missing \"base64\" after \"subType\"");
          if (pcVar19 == (char *)0x0) goto LAB_001314c6;
          apcStack_f88[0] = (code *)0x131447;
          cVar1 = bson_init_from_json(apppcStack_f00,
                                      "{\"b\": {\"$binary\": {\"base64\": \"Zm9v\"}}}",
                                      0xffffffffffffffff,&iStack_e30);
          if (cVar1 != '\0') goto LAB_00131489;
          if (iStack_e30 != 1) goto LAB_001314ce;
          if (iStack_e2c != 2) goto LAB_001314d3;
          apcStack_f88[0] = (code *)0x131472;
          pcVar19 = strstr((char *)pppppcVar6,"Missing \"subType\" after \"base64\"");
          if (pcVar19 != (char *)0x0) {
            return;
          }
          goto LAB_001314d8;
        }
        apcStack_f88[0] = (code *)0x1313a6;
        iVar2 = strcmp((char *)ppppcStack_f10,"foo");
        pppppcVar6 = (char *****)ppppcStack_f10;
        if (iVar2 == 0) goto LAB_001313ae;
      }
      apcStack_f88[0] = test_bson_json_read_legacy_binary;
      test_bson_json_read_binary_cold_8();
      pcVar20 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
      ppuVar23 = &PTR_anon_var_dwarf_1a702_00163258;
      pcVar19 = "foo";
      ppppcStack_fb0 = (char ****)pppppcVar6;
      pcStack_fa8 = unaff_R12;
      ppuStack_fa0 = ppuVar26;
      ppppcStack_f98 = (char ****)pppppcVar29;
      piStack_f90 = piVar30;
      apcStack_f88[0] = (code *)&pcStack_b88;
      break;
    }
    if (local_2b4 != 2) goto LAB_00130ed8;
    unaff_R12 = ppuVar26[-1];
    pcStack_388 = (code *)0x130eaa;
    pcVar19 = strstr((char *)pppppcVar6,unaff_R12);
    if (pcVar19 == (char *)0x0) goto LAB_00130edd;
    pcStack_388 = (code *)0x130eb7;
    bson_destroy(apppcStack_380);
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 2;
    if (pcVar19 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_0013152a:
  apcStack_1388[0] = (code *)0x131541;
  cVar1 = bson_init_from_json(acStack_1300,pcVar20,0xffffffffffffffff,auStack_1238);
  if (cVar1 == '\0') {
LAB_001315d9:
    apcStack_1388[0] = (code *)0x1315e6;
    test_bson_json_read_legacy_binary_cold_1();
LAB_001315e6:
    apcStack_1388[0] = test_json_reader_new_from_file;
    test_bson_json_read_legacy_binary_cold_4();
    pcStack_1398 = "foo";
    aiStack_1700[0x1c] = 0;
    aiStack_1700[0x1d] = 0;
    aiStack_1700[0x1e] = 0;
    aiStack_1700[0x1f] = 0;
    aiStack_1700[0x18] = 0;
    aiStack_1700[0x19] = 0;
    aiStack_1700[0x1a] = 0;
    aiStack_1700[0x1b] = 0;
    aiStack_1700[0x14] = 0;
    aiStack_1700[0x15] = 0;
    aiStack_1700[0x16] = 0;
    aiStack_1700[0x17] = 0;
    aiStack_1700[0x10] = 0;
    aiStack_1700[0x11] = 0;
    aiStack_1700[0x12] = 0;
    aiStack_1700[0x13] = 0;
    aiStack_1700[0xc] = 0;
    aiStack_1700[0xd] = 0;
    aiStack_1700[0xe] = 0;
    aiStack_1700[0xf] = 0;
    aiStack_1700[8] = 0;
    aiStack_1700[9] = 0;
    aiStack_1700[10] = 0;
    aiStack_1700[0xb] = 0;
    aiStack_1700[4] = 0;
    aiStack_1700[5] = 0;
    aiStack_1700[6] = 0;
    aiStack_1700[7] = 0;
    aiStack_1700[0] = 3;
    aiStack_1700[1] = 5;
    aiStack_1700[2] = 5;
    aiStack_1700[3] = 0;
    pcStack_1788 = (code *)0x131673;
    pcStack_13a0 = acStack_1300;
    piStack_1390 = piVar30;
    apcStack_1388[0] = (code *)apcStack_f88;
    pcVar20 = (char *)bson_json_reader_new_from_file
                                ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/test.json"
                                 ,auStack_1628);
    if (pcVar20 == (char *)0x0) {
      pcStack_1788 = (code *)0x1317bc;
      test_json_reader_new_from_file_cold_6();
      pcVar20 = acStack_1300;
LAB_001317bc:
      pcStack_1788 = (code *)0x1317c1;
      test_json_reader_new_from_file_cold_5();
LAB_001317c1:
      pcStack_1788 = (code *)0x1317d9;
      test_json_reader_new_from_file_cold_1();
LAB_001317d9:
      pcStack_1788 = (code *)0x1317de;
      test_json_reader_new_from_file_cold_3();
LAB_001317de:
      pcStack_1788 = (code *)0x1317f6;
      test_json_reader_new_from_file_cold_4();
    }
    else {
      pcStack_1788 = (code *)0x131697;
      iVar2 = bson_json_reader_read(pcVar20,aiStack_1700,auStack_1628);
      if (iVar2 != 1) goto LAB_001317c1;
      pcStack_1788 = (code *)0x1316a5;
      pcVar19 = (char *)bson_bcone_magic();
      piStack_1790 = &iStack_1704;
      pcStack_1788 = (code *)0x0;
      uStack_1798 = 0xf;
      uStack_17a8 = 0x1316e2;
      pcStack_17a0 = pcVar19;
      bcon_extract(aiStack_1700,"foo",pcVar19,0,&piStack_1640,"a");
      piVar30 = piStack_1640;
      if (piStack_1640 == (int *)0x1428c0) {
LAB_0013170c:
        if (iStack_1704 != 1) goto LAB_001317d9;
        piVar30 = aiStack_1700;
        pcStack_1788 = (code *)0x131729;
        bson_reinit(piVar30);
        pcStack_1788 = (code *)0x13173c;
        iVar2 = bson_json_reader_read(pcVar20,piVar30,auStack_1628);
        if (iVar2 == 1) {
          piVar30 = (int *)&uStack_1648;
          pcStack_1788 = (code *)0x131771;
          bcon_extract(aiStack_1700,"_id",pcVar19,6,piVar30,0);
          pcVar19 = acStack_1634;
          pcStack_1788 = (code *)0x131788;
          bson_oid_init_from_string(pcVar19,"aabbccddeeff001122334455");
          pcStack_1788 = (code *)0x131793;
          cVar1 = bson_oid_equal(pcVar19,uStack_1648);
          if (cVar1 != '\0') {
            pcStack_1788 = (code *)0x1317a4;
            bson_destroy(aiStack_1700);
            pcStack_1788 = (code *)0x1317ac;
            bson_json_reader_destroy(pcVar20);
            return;
          }
          goto LAB_001317bc;
        }
        goto LAB_001317de;
      }
      pcStack_1788 = (code *)0x131704;
      iVar2 = strcmp("bar",(char *)piStack_1640);
      if (iVar2 == 0) goto LAB_0013170c;
    }
    pcStack_1788 = test_json_reader_new_from_bad_path;
    test_json_reader_new_from_file_cold_2();
    apcStack_1990[0] = (code *)0x131816;
    lVar7 = bson_json_reader_new_from_file
                      ("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/json/does-not-exist"
                       ,&iStack_1980);
    if (lVar7 == 0) {
      if (iStack_1980 != 2) goto LAB_0013183a;
      if (iStack_197c == 1) {
        return;
      }
    }
    else {
      apcStack_1990[0] = (code *)0x13183a;
      test_json_reader_new_from_bad_path_cold_1();
LAB_0013183a:
      apcStack_1990[0] = (code *)0x13183f;
      test_json_reader_new_from_bad_path_cold_2();
    }
    apcStack_1990[0] = test_bson_json_number_long;
    test_json_reader_new_from_bad_path_cold_3();
    pcStack_1d88 = (code *)0x131877;
    pcStack_1998 = pcVar20;
    apcStack_1990[0] = (code *)apcStack_1388;
    cVar1 = bson_init_from_json(acStack_1d00,"{\"key\": {\"$numberLong\": \"4611686018427387904\"}}"
                                ,0xffffffffffffffff,&iStack_1c18);
    if (cVar1 == '\0') {
LAB_00131c0c:
      pcStack_1d88 = (code *)0x131c19;
      test_bson_json_number_long_cold_1();
LAB_00131c19:
      pcStack_1d88 = (code *)0x131c26;
      test_bson_json_number_long_cold_6();
LAB_00131c26:
      pcStack_1d88 = (code *)0x131c2e;
      test_bson_json_number_long_cold_9();
LAB_00131c2e:
      pcStack_1d88 = (code *)0x131c3b;
      test_bson_json_number_long_cold_10();
LAB_00131c3b:
      pcStack_1d88 = (code *)0x131c43;
      test_bson_json_number_long_cold_13();
LAB_00131c43:
      pcStack_1d88 = (code *)0x131c48;
      test_bson_json_number_long_cold_14();
LAB_00131c48:
      pcStack_1d88 = (code *)0x131c4d;
      test_bson_json_number_long_cold_15();
LAB_00131c4d:
      pcStack_1d88 = (code *)0x131c55;
      test_bson_json_number_long_cold_28();
LAB_00131c55:
      pcStack_1d88 = (code *)0x131c5a;
      test_bson_json_number_long_cold_16();
LAB_00131c5a:
      pcStack_1d88 = (code *)0x131c5f;
      test_bson_json_number_long_cold_17();
LAB_00131c5f:
      pcStack_1d88 = (code *)0x131c67;
      test_bson_json_number_long_cold_26();
LAB_00131c67:
      pcStack_1d88 = (code *)0x131c6c;
      test_bson_json_number_long_cold_18();
LAB_00131c6c:
      pcStack_1d88 = (code *)0x131c71;
      test_bson_json_number_long_cold_19();
LAB_00131c71:
      pcStack_1d88 = (code *)0x131c79;
      test_bson_json_number_long_cold_24();
LAB_00131c79:
      pcStack_1d88 = (code *)0x131c7e;
      test_bson_json_number_long_cold_20();
LAB_00131c7e:
      pcStack_1d88 = (code *)0x131c83;
      test_bson_json_number_long_cold_21();
    }
    else {
      pcStack_1d88 = (code *)0x13188f;
      cVar1 = bson_iter_init(auStack_1d80,acStack_1d00);
      if (cVar1 == '\0') {
        pcStack_1d88 = (code *)0x131bcb;
        test_bson_json_number_long_cold_2();
LAB_00131bcb:
        pcStack_1d88 = (code *)0x131bd0;
        test_bson_json_number_long_cold_3();
LAB_00131bd0:
        pcStack_1d88 = (code *)0x131bd5;
        test_bson_json_number_long_cold_4();
LAB_00131bd5:
        pcStack_1d88 = (code *)0x131bda;
        test_bson_json_number_long_cold_5();
LAB_00131bda:
        pcStack_1d88 = (code *)0x131bdf;
        test_bson_json_number_long_cold_31();
LAB_00131bdf:
        pcStack_1d88 = (code *)0x131be4;
        test_bson_json_number_long_cold_30();
LAB_00131be4:
        pcStack_1d88 = (code *)0x131be9;
        test_bson_json_number_long_cold_7();
LAB_00131be9:
        pcStack_1d88 = (code *)0x131bee;
        test_bson_json_number_long_cold_8();
LAB_00131bee:
        pcStack_1d88 = (code *)0x131bf3;
        test_bson_json_number_long_cold_11();
LAB_00131bf3:
        pcStack_1d88 = (code *)0x131bf8;
        test_bson_json_number_long_cold_12();
LAB_00131bf8:
        pcStack_1d88 = (code *)0x131bfd;
        test_bson_json_number_long_cold_29();
LAB_00131bfd:
        pcStack_1d88 = (code *)0x131c02;
        test_bson_json_number_long_cold_27();
LAB_00131c02:
        pcStack_1d88 = (code *)0x131c07;
        test_bson_json_number_long_cold_25();
LAB_00131c07:
        pcStack_1d88 = (code *)0x131c0c;
        test_bson_json_number_long_cold_23();
        goto LAB_00131c0c;
      }
      pcStack_1d88 = (code *)0x1318a6;
      cVar1 = bson_iter_find(auStack_1d80,"key");
      if (cVar1 == '\0') goto LAB_00131bcb;
      pcStack_1d88 = (code *)0x1318b6;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00131bd0;
      pcStack_1d88 = (code *)0x1318c7;
      lVar7 = bson_iter_int64(auStack_1d80);
      if (lVar7 != 0x4000000000000000) goto LAB_00131bd5;
      pcVar20 = acStack_1d00;
      pcStack_1d88 = (code *)0x1318ea;
      bson_destroy(pcVar20);
      pcStack_1d88 = (code *)0x131908;
      cVar1 = bson_init_from_json(pcVar20,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131bda;
      pcStack_1d88 = (code *)0x131933;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"key\": {\"$numberLong\": \"461168601abcd\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131bdf;
      pcStack_1d88 = (code *)0x13195e;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"x\": {\"$numberLong\": \"9223372036854775807\"}}"
                                  ,0xffffffffffffffff,&iStack_1c18);
      if (cVar1 == '\0') goto LAB_00131c19;
      pcStack_1d88 = (code *)0x13197d;
      cVar1 = bson_iter_init_find(auStack_1d80,acStack_1d00,"x");
      if (cVar1 == '\0') goto LAB_00131be4;
      pcStack_1d88 = (code *)0x13198d;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00131be9;
      pcVar20 = (char *)0x7fffffffffffffff;
      pcStack_1d88 = (code *)0x1319a8;
      lVar7 = bson_iter_int64(auStack_1d80);
      if (lVar7 != 0x7fffffffffffffff) goto LAB_00131c26;
      pcStack_1d88 = (code *)0x1319d4;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"-9223372036854775808\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 == '\0') goto LAB_00131c2e;
      pcStack_1d88 = (code *)0x1319f3;
      cVar1 = bson_iter_init_find(auStack_1d80,acStack_1d00,"x");
      if (cVar1 == '\0') goto LAB_00131bee;
      pcStack_1d88 = (code *)0x131a03;
      iVar2 = bson_iter_type(auStack_1d80);
      if (iVar2 != 0x12) goto LAB_00131bf3;
      pcStack_1d88 = (code *)0x131a14;
      lVar7 = bson_iter_int64(auStack_1d80);
      pcVar20 = (char *)0x8000000000000000;
      if (lVar7 != -0x8000000000000000) goto LAB_00131c3b;
      pcVar20 = acStack_1d00;
      pcStack_1d88 = (code *)0x131a30;
      bson_destroy(pcVar20);
      pcStack_1d88 = (code *)0x131a4e;
      cVar1 = bson_init_from_json(pcVar20,"{\"x\": {\"$numberLong\": \"9223372036854775808\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131bf8;
      if (iStack_1c18 != 1) goto LAB_00131c43;
      if (iStack_1c14 != 2) goto LAB_00131c48;
      pcVar20 = acStack_1c10;
      pcStack_1d88 = (code *)0x131a8d;
      pcVar8 = strstr(pcVar20,"Number \"9223372036854775808\" is out of range");
      if (pcVar8 == (char *)0x0) goto LAB_00131c4d;
      pcStack_1d88 = (code *)0x131ab9;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"-9223372036854775809\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131bfd;
      if (iStack_1c18 != 1) goto LAB_00131c55;
      if (iStack_1c14 != 2) goto LAB_00131c5a;
      pcStack_1d88 = (code *)0x131af0;
      pcVar8 = strstr(pcVar20,"Number \"-9223372036854775809\" is out of range");
      if (pcVar8 == (char *)0x0) goto LAB_00131c5f;
      pcStack_1d88 = (code *)0x131b1c;
      cVar1 = bson_init_from_json(acStack_1d00,
                                  "{\"x\": {\"$numberLong\": \"10000000000000000000\"}}",
                                  0xffffffffffffffff,&iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131c02;
      if (iStack_1c18 != 1) goto LAB_00131c67;
      if (iStack_1c14 != 2) goto LAB_00131c6c;
      pcStack_1d88 = (code *)0x131b53;
      pcVar8 = strstr(pcVar20,"Number \"10000000000000000000\" is out of range");
      if (pcVar8 == (char *)0x0) goto LAB_00131c71;
      pcStack_1d88 = (code *)0x131b7f;
      cVar1 = bson_init_from_json(acStack_1d00,"{\"x\": -10000000000000000000}",0xffffffffffffffff,
                                  &iStack_1c18);
      if (cVar1 != '\0') goto LAB_00131c07;
      if (iStack_1c18 != 1) goto LAB_00131c79;
      if (iStack_1c14 != 2) goto LAB_00131c7e;
      pcStack_1d88 = (code *)0x131bb6;
      pcVar8 = strstr(pcVar20,"Number \"-10000000000000000000\" is out of range");
      if (pcVar8 != (char *)0x0) {
        return;
      }
    }
    pcStack_1d88 = test_bson_json_number_long_zero;
    test_bson_json_number_long_cold_22();
    pcStack_2188 = (code *)0x131cbd;
    pcStack_1d88 = (code *)apcStack_1990;
    cVar1 = bson_init_from_json(auStack_2100,"{ \"key\": { \"$numberLong\": \"0\" }}",
                                0xffffffffffffffff,auStack_2010);
    if (cVar1 != '\0') {
      pcStack_2188 = (code *)0x131cd1;
      cVar1 = bson_iter_init(auStack_2180,auStack_2100);
      if (cVar1 == '\0') {
        pcStack_2188 = (code *)0x131d19;
        test_bson_json_number_long_zero_cold_2();
LAB_00131d19:
        pcStack_2188 = (code *)0x131d1e;
        test_bson_json_number_long_zero_cold_3();
LAB_00131d1e:
        pcStack_2188 = (code *)0x131d23;
        test_bson_json_number_long_zero_cold_4();
      }
      else {
        pcStack_2188 = (code *)0x131ce4;
        cVar1 = bson_iter_find(auStack_2180,"key");
        if (cVar1 == '\0') goto LAB_00131d19;
        pcStack_2188 = (code *)0x131cf0;
        iVar2 = bson_iter_type(auStack_2180);
        if (iVar2 != 0x12) goto LAB_00131d1e;
        pcStack_2188 = (code *)0x131cfd;
        lVar7 = bson_iter_int64(auStack_2180);
        if (lVar7 == 0) {
          pcStack_2188 = (code *)0x131d0f;
          bson_destroy(auStack_2100);
          return;
        }
      }
      pcStack_2188 = (code *)0x131d28;
      test_bson_json_number_long_zero_cold_5();
    }
    pcStack_2188 = test_bson_json_code;
    test_bson_json_number_long_zero_cold_1();
    apcStack_2688[0] = (code *)0x131d52;
    pcStack_21b0 = pcVar20;
    ppuStack_21a8 = ppuVar23;
    ppiStack_21a0 = &piStack_1308;
    pcStack_2198 = pcVar19;
    piStack_2190 = piVar30;
    pcStack_2188 = (code *)&pcStack_1d88;
    lVar7 = bson_bcon_magic();
    apcStack_2688[0] = (code *)0x131d7d;
    pcStack_2620 = (char *)bcon_new(0,"a",lVar7,0xc,"b",0);
    apcStack_2688[0] = (code *)0x131da0;
    uStack_2628 = bcon_new(0,"a",lVar7,0xc,"b",0);
    apcStack_2688[0] = (code *)0x131dc6;
    uVar5 = bcon_new(0,"var",lVar7,0xf,1,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x131dec;
    uStack_25b8 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
    apcStack_2688[0] = (code *)0x131e19;
    uVar9 = bcon_new(0,"var2",lVar7,0x11,2,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x131e3f;
    uStack_25c0 = bcon_new(0,"a",lVar7,0xe,"b",uVar9);
    apcStack_2688[0] = (code *)0x0;
    pcStack_2698 = "d";
    pcStack_26a0 = (char *)0xe;
    pcStack_26b0 = "c";
    pcStack_26b8 = (char *)0x131e89;
    pcStack_26a8 = (char *)lVar7;
    pcStack_2690 = (char *)uVar9;
    uStack_25f8 = uVar9;
    uStack_25c8 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = "}";
    pcStack_26a0 = "}";
    pcStack_26a8 = "value2";
    pcStack_26b0 = (char *)0x0;
    pcStack_26c0 = "key2";
    pcStack_26c8 = "{";
    pcStack_26d0 = "subdoc";
    pcStack_26d8 = "value";
    lStack_26e0 = 0;
    pcStack_26f0 = "key1";
    pcStack_26f8 = "{";
    pcStack_2700 = "c";
    uStack_2708 = 0x131f0d;
    pcStack_26e8 = (char *)lVar7;
    pcStack_26b8 = (char *)lVar7;
    uStack_25d0 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x131f51;
    uStack_25f0 = uVar5;
    uStack_25d8 = bcon_new(0,"a",lVar7,0xe,"b",uVar5);
    apcStack_2688[0] = (code *)0x131f7a;
    uStack_2600 = bcon_new(0,"var","{","}",0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x131fa2;
    uStack_25e0 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2600);
    apcStack_2688[0] = (code *)0x0;
    pcStack_2690 = "}";
    pcStack_2698 = "}";
    pcStack_26a0 = (char *)0x3;
    pcStack_26a8 = (char *)0xf;
    pcStack_26b8 = "z";
    pcStack_26c0 = "{";
    pcStack_26c8 = "d3";
    pcStack_26d0 = (char *)0x1;
    pcStack_26d8 = (char *)0xf;
    pcStack_26e8 = "x";
    pcStack_26f0 = "{";
    pcStack_26f8 = "d2";
    pcStack_2700 = (char *)0x1;
    uStack_2708 = 0x11;
    pcStack_2718 = "n";
    pcStack_2720 = "}";
    pcStack_2728 = "{";
    pcStack_2730 = "d";
    pcStack_2738 = "]";
    uStack_2740 = 2;
    uStack_2748 = 0xf;
    uStack_2758 = 0x132050;
    lStack_2750 = lVar7;
    lStack_2710 = lVar7;
    lStack_26e0 = lVar7;
    pcStack_26b0 = (char *)lVar7;
    uStack_2608 = bcon_new(0,"arr","[",lVar7,0xf,1);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x13208c;
    uStack_25e8 = bcon_new(0,"a",lVar7,0xe,"b",uStack_2608);
    apcStack_2688[0] = (code *)0x13209d;
    uStack_2610 = bson_new();
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x1320c5;
    pcVar20 = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_2610);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = "}";
    pcStack_26a0 = "c";
    pcStack_26a8 = (char *)0x132108;
    uStack_2618 = bcon_new(0,"x","{","$code",lVar7,0);
    pcStack_2690 = (char *)0x0;
    pcStack_2698 = (char *)0x13212d;
    apcStack_25b0[0x15] = (char *)bcon_new(0,"a",lVar7,0xe,"b",uStack_2618);
    apcStack_25b0[0] = "{\"a\": {\"$code\": \"b\"}}";
    apcStack_25b0[1] = pcStack_2620;
    apcStack_25b0[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
    apcStack_25b0[3] = (char *)uStack_2628;
    apcStack_25b0[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
    apcStack_25b0[5] = (char *)uStack_25b8;
    apcStack_25b0[6] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
    apcStack_25b0[7] = (char *)uStack_25c0;
    apcStack_25b0[8] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
    ;
    apcStack_25b0[9] = (char *)uStack_25d0;
    apcStack_25b0[10] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
    ;
    apcStack_25b0[0xb] = (char *)uStack_25c8;
    apcStack_25b0[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
    apcStack_25b0[0xd] = (char *)uStack_25d8;
    apcStack_25b0[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
    apcStack_25b0[0xf] = (char *)uStack_25e0;
    apcStack_25b0[0x10] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
    ;
    apcStack_25b0[0x11] = (char *)uStack_25e8;
    apcStack_25b0[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
    apcStack_25b0[0x13] = pcVar20;
    apcStack_25b0[0x14] =
         "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
    pcVar24 = (char *)0x8;
    pcVar19 = acStack_2500;
    pcVar8 = "b";
    goto LAB_0013227e;
  }
  apcStack_1388[0] = (code *)0x13154e;
  uVar5 = bson_bcone_magic();
  apcStack_1388[0] = (code *)0x0;
  piStack_1390 = &iStack_1310;
  pcStack_1398 = (char *)0x131578;
  bcon_extract(acStack_1300,"x",uVar5,4,&iStack_130c,&piStack_1308);
  if (iStack_130c != 5) {
LAB_001315d4:
    apcStack_1388[0] = (code *)0x1315d9;
    test_bson_json_read_legacy_binary_cold_2();
    goto LAB_001315d9;
  }
  if (iStack_1310 != 3) {
    apcStack_1388[0] = (code *)0x1315d4;
    test_bson_json_read_legacy_binary_cold_3();
    goto LAB_001315d4;
  }
  piVar30 = piStack_1308;
  if (piStack_1308 != (int *)"foo") {
    apcStack_1388[0] = (code *)0x1315a3;
    iVar2 = strcmp((char *)piStack_1308,"foo");
    if (iVar2 == 0) goto LAB_001315a7;
    goto LAB_001315e6;
  }
LAB_001315a7:
  apcStack_1388[0] = (code *)0x1315af;
  bson_destroy(acStack_1300);
  pcVar20 = *ppuVar23;
  ppuVar23 = ppuVar23 + 1;
  if (pcVar20 == (char *)0x0) {
    return;
  }
  goto LAB_0013152a;
LAB_0013227e:
  apcStack_2688[0] = (code *)0x13229d;
  cVar1 = bson_init_from_json(pcVar19,*(undefined8 *)((long)&uStack_25b8 + (long)pcVar24),
                              0xffffffffffffffff,auStack_2438);
  __needle = pcVar24;
  if (cVar1 == '\0') goto LAB_001324a3;
  apcStack_2688[0] = (code *)0x1322b0;
  pcStack_2620 = (char *)bson_get_data(pcVar19);
  lVar7 = *(long *)((long)apcStack_25b0 + (long)pcVar24);
  apcStack_2688[0] = (code *)0x1322c5;
  __needle = (char *)bson_get_data(lVar7);
  if (*(uint *)(lVar7 + 4) != uStack_24fc) {
LAB_00132392:
    pcVar19 = acStack_2500;
    apcStack_2688[0] = (code *)0x1323a4;
    pcVar8 = (char *)bson_as_canonical_extended_json(pcVar19);
    apcStack_2688[0] = (code *)0x1323b1;
    uVar5 = bson_as_canonical_extended_json(lVar7);
    pcVar20 = pcStack_2620;
    uVar3 = *(uint *)(lVar7 + 4);
    if (uStack_24fc == 0) goto LAB_001323e2;
    uVar21 = 0;
    goto LAB_001323c8;
  }
  apcStack_2688[0] = (code *)0x1322e1;
  pvVar10 = (void *)bson_get_data(lVar7);
  apcStack_2688[0] = (code *)0x1322ec;
  pvVar11 = (void *)bson_get_data(pcVar19);
  apcStack_2688[0] = (code *)0x1322fb;
  iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(lVar7 + 4));
  if (iVar2 != 0) goto LAB_00132392;
  apcStack_2688[0] = (code *)0x13230e;
  bson_destroy(pcVar19);
  pcVar24 = pcVar24 + 0x10;
  pcVar8 = pcVar19;
  pcVar20 = __needle;
  if (pcVar24 == (char *)0xb8) {
    lVar7 = 8;
    do {
      apcStack_2688[0] = (code *)0x132331;
      bson_destroy(*(undefined8 *)((long)apcStack_25b0 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0xb8);
    apcStack_2688[0] = (code *)0x13234b;
    bson_destroy(uStack_25f0);
    apcStack_2688[0] = (code *)0x132358;
    bson_destroy(uStack_25f8);
    apcStack_2688[0] = (code *)0x132365;
    bson_destroy(uStack_2600);
    apcStack_2688[0] = (code *)0x13236f;
    bson_destroy(uStack_2608);
    apcStack_2688[0] = (code *)0x132379;
    bson_destroy(uStack_2618);
    apcStack_2688[0] = (code *)0x132383;
    bson_destroy(uStack_2610);
    return;
  }
  goto LAB_0013227e;
  while( true ) {
    if (pcStack_2620[uVar21] != __needle[uVar21]) goto LAB_00132488;
    uVar21 = uVar21 + 1;
    if (uStack_24fc == (uint)uVar21) break;
LAB_001323c8:
    if (uVar3 == (uint)uVar21) break;
  }
LAB_001323e2:
  uVar4 = uStack_24fc;
  if (uStack_24fc < uVar3) {
    uVar4 = uVar3;
  }
  uVar21 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_2688[0] = (code *)0x132407;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,pcVar8,uVar5);
    apcStack_2688[0] = (code *)0x13241f;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar8 = (char *)(ulong)uVar3;
    apcStack_2688[0] = (code *)0x132439;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2628 = CONCAT44(uStack_2628._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar19 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132494;
    pcVar8 = (char *)(ulong)uStack_24fc;
    apcStack_2688[0] = (code *)0x132460;
    pcVar24 = (char *)write(uVar3,pcVar20,(size_t)pcVar8);
    if (pcVar24 != pcVar8) goto LAB_00132499;
    pcVar8 = (char *)(ulong)*(uint *)(lVar7 + 4);
    apcStack_2688[0] = (code *)0x132477;
    pcVar24 = (char *)write(uVar4,__needle,(size_t)pcVar8);
    if (pcVar24 != pcVar8) goto LAB_0013249e;
    uVar21 = (ulong)uVar4;
    apcStack_2688[0] = (code *)0x132488;
    test_bson_json_code_cold_4();
    uVar5 = extraout_RAX;
LAB_00132488:
    uVar21 = uVar21 & 0xffffffff;
  }
  apcStack_2688[0] = (code *)0x132494;
  test_bson_json_code_cold_6();
LAB_00132494:
  apcStack_2688[0] = (code *)0x132499;
  test_bson_json_code_cold_5();
LAB_00132499:
  apcStack_2688[0] = (code *)0x13249e;
  test_bson_json_code_cold_2();
LAB_0013249e:
  apcStack_2688[0] = (code *)0x1324a3;
  test_bson_json_code_cold_3();
LAB_001324a3:
  apcStack_2688[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar27 = 8;
  pcStack_26b0 = pcVar8;
  pcStack_26a8 = __needle;
  pcStack_26a0 = pcVar20;
  pcStack_2698 = pcVar19;
  pcStack_2690 = (char *)lVar7;
  apcStack_2688[0] = (code *)&pcStack_2188;
  do {
    pcStack_2a08 = (code *)0x1324f7;
    cVar1 = bson_init_from_json(auStack_2800,*(undefined8 *)(&UNK_00163268 + lVar27),
                                0xffffffffffffffff,&iStack_2a00);
    if (cVar1 != '\0') {
      pcStack_2a08 = (code *)0x132544;
      test_bson_json_code_errors_cold_3();
LAB_00132544:
      pcStack_2a08 = (code *)0x132549;
      test_bson_json_code_errors_cold_2();
LAB_00132549:
      pcStack_2a08 = (code *)0x132569;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_29f8,
              __needle);
      pcStack_2a08 = (code *)0x13256e;
      abort();
    }
    if (iStack_2a00 != 1) {
      pcStack_2a08 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_2a30 = &PTR_anon_var_dwarf_1aa32_00163270;
      apcStack_2e08[0] = (code *)0x132590;
      pcStack_2a28 = __needle;
      lStack_2a20 = lVar27;
      puStack_2a18 = auStack_2800;
      puStack_2a10 = (undefined1 *)&iStack_2a00;
      pcStack_2a08 = (code *)apcStack_2688;
      uVar5 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_2e08[0] = (code *)0x1325af;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar11 = (void *)0x0;
      pcVar19 = "$ref";
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = oid_zero_oid;
      pcStack_2e28 = (char *)0x6;
      pcStack_2e38 = "$id";
      pcStack_2e40 = "collection";
      pcStack_2e48 = (char *)0x132610;
      pcStack_2e30 = (char *)uVar5;
      pvStack_2dc8 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0xf;
      pcStack_2e38 = "$id";
      pcStack_2e40 = "collection";
      pcStack_2e48 = (char *)0x132660;
      pcStack_2e30 = (char *)uVar5;
      uStack_2dd0 = bcon_new(0,"key","{","$ref",uVar5,0);
      apcStack_2e08[0] = (code *)0x0;
      pcStack_2e10 = "}";
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0xf;
      pcStack_2e38 = "a";
      pcStack_2e40 = "{";
      pcStack_2e48 = "$id";
      pcStack_2e50 = "collection";
      pcStack_2e58 = (char *)0x1326b8;
      pcStack_2e30 = (char *)uVar5;
      pvVar10 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2e10 = (char *)0x0;
      pcStack_2e18 = "}";
      pcStack_2e20 = (char *)0x1;
      pcStack_2e28 = (char *)0x7;
      pcStack_2e38 = "meta";
      pcStack_2e40 = (char *)0x1;
      pcStack_2e48 = (char *)0xf;
      pcStack_2e58 = "$id";
      pcStack_2e60 = "collection";
      uStack_2e68 = 0x13271b;
      pcStack_2e50 = (char *)uVar5;
      pcStack_2e30 = (char *)uVar5;
      uStack_2d88 = bcon_new(0,"key","{","$ref",uVar5,0);
      pcStack_2dc0 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_2db8 = pvStack_2dc8;
      pcStack_2db0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_2da8 = uStack_2dd0;
      pcStack_2da0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_2d98 = pvVar10;
      pcStack_2d90 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar20 = "key";
      break;
    }
    if (iStack_29fc != 2) goto LAB_00132544;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1aa32_00163270 + lVar27);
    pcStack_2a08 = (code *)0x13251e;
    pcVar19 = strstr(acStack_29f8,__needle);
    if (pcVar19 == (char *)0x0) goto LAB_00132549;
    lVar27 = lVar27 + 0x10;
    if (lVar27 == 0x98) {
      return;
    }
  } while( true );
LAB_00132775:
  apcStack_2e08[0] = (code *)0x132791;
  cVar1 = bson_init_from_json(acStack_2d80,*(undefined8 *)((long)&pcStack_2dc0 + (long)pvVar11),
                              0xffffffffffffffff,auStack_2cb8);
  pcVar8 = acStack_2d80;
  pvVar12 = pvVar11;
  if (cVar1 == '\0') goto LAB_0013293d;
  apcStack_2e08[0] = (code *)0x1327a4;
  pvStack_2dc8 = (void *)bson_get_data(acStack_2d80);
  pcVar8 = *(char **)((long)&pvStack_2db8 + (long)pvVar11);
  apcStack_2e08[0] = (code *)0x1327b6;
  pvVar12 = (void *)bson_get_data(pcVar8);
  if (*(uint *)(pcVar8 + 4) != uStack_2d7c) {
LAB_0013282b:
    pcVar19 = acStack_2d80;
    apcStack_2e08[0] = (code *)0x13283d;
    pcVar20 = (char *)bson_as_canonical_extended_json(pcVar19);
    apcStack_2e08[0] = (code *)0x13284a;
    uVar5 = bson_as_canonical_extended_json(pcVar8);
    pvVar10 = pvStack_2dc8;
    uVar3 = *(uint *)(pcVar8 + 4);
    if (uStack_2d7c == 0) goto LAB_00132879;
    uVar21 = 0;
    goto LAB_00132860;
  }
  apcStack_2e08[0] = (code *)0x1327cd;
  pcVar19 = (char *)bson_get_data(pcVar8);
  apcStack_2e08[0] = (code *)0x1327d8;
  pvVar10 = (void *)bson_get_data(acStack_2d80);
  apcStack_2e08[0] = (code *)0x1327e6;
  iVar2 = bcmp(pcVar19,pvVar10,(ulong)*(uint *)(pcVar8 + 4));
  if (iVar2 != 0) goto LAB_0013282b;
  apcStack_2e08[0] = (code *)0x1327f5;
  bson_destroy(acStack_2d80);
  pvVar11 = (void *)((long)pvVar11 + 0x10);
  pcVar20 = acStack_2d80;
  pvVar10 = pvVar12;
  if (pvVar11 == (void *)0x40) {
    lVar7 = 8;
    do {
      apcStack_2e08[0] = (code *)0x132812;
      bson_destroy(*(undefined8 *)((long)&pcStack_2dc0 + lVar7));
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x48);
    return;
  }
  goto LAB_00132775;
  while( true ) {
    if (*(char *)((long)pvStack_2dc8 + uVar21) != *(char *)((long)pvVar12 + uVar21))
    goto LAB_00132922;
    uVar21 = uVar21 + 1;
    if (uStack_2d7c == (uint)uVar21) break;
LAB_00132860:
    if (uVar3 == (uint)uVar21) break;
  }
LAB_00132879:
  uVar4 = uStack_2d7c;
  if (uStack_2d7c < uVar3) {
    uVar4 = uVar3;
  }
  uVar21 = (ulong)(uVar4 - 1);
  while( true ) {
    apcStack_2e08[0] = (code *)0x13289e;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,pcVar20,uVar5);
    apcStack_2e08[0] = (code *)0x1328b6;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar20 = (char *)(ulong)uVar3;
    apcStack_2e08[0] = (code *)0x1328d1;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2dd0 = CONCAT44(uStack_2dd0._4_4_,uVar3);
    if (uVar3 == 0xffffffff) break;
    pcVar19 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013292e;
    pcVar20 = (char *)(ulong)uStack_2d7c;
    apcStack_2e08[0] = (code *)0x1328fb;
    pcVar24 = (char *)write(uVar3,pvVar10,(size_t)pcVar20);
    if (pcVar24 != pcVar20) goto LAB_00132933;
    pcVar8 = (char *)(ulong)*(uint *)(pcVar8 + 4);
    apcStack_2e08[0] = (code *)0x132911;
    pcVar24 = (char *)write(uVar4,pvVar12,(size_t)pcVar8);
    if (pcVar24 != pcVar8) goto LAB_00132938;
    uVar21 = (ulong)uVar4;
    apcStack_2e08[0] = (code *)0x132922;
    test_bson_json_dbref_cold_4();
    uVar5 = extraout_RAX_00;
LAB_00132922:
    uVar21 = uVar21 & 0xffffffff;
  }
  apcStack_2e08[0] = (code *)0x13292e;
  test_bson_json_dbref_cold_6();
LAB_0013292e:
  apcStack_2e08[0] = (code *)0x132933;
  test_bson_json_dbref_cold_5();
LAB_00132933:
  apcStack_2e08[0] = (code *)0x132938;
  test_bson_json_dbref_cold_2();
LAB_00132938:
  apcStack_2e08[0] = (code *)0x13293d;
  test_bson_json_dbref_cold_3();
LAB_0013293d:
  apcStack_2e08[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  pcStack_3208 = (code *)0x132967;
  pcStack_2e30 = pcVar8;
  pcStack_2e28 = pcVar20;
  pcStack_2e20 = pcVar19;
  pcStack_2e18 = (char *)pvVar12;
  pcStack_2e10 = (char *)pvVar10;
  apcStack_2e08[0] = (code *)&pcStack_2a08;
  uVar5 = bson_bcon_magic();
  pcStack_3208 = (code *)0x132989;
  pvStack_31f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_48e4 + 0xc,0);
  pcStack_3208 = (code *)0x1329ad;
  pvVar10 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  pcStack_3208 = (code *)0x1329cf;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  pcStack_3208 = (code *)0x1329f1;
  puVar13 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  pcStack_3208 = (code *)0x132a0f;
  uVar9 = bcon_new(0,"",uVar5,0,"",0);
  pcStack_3208 = (code *)0x132a31;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  pcStack_3208 = (code *)0x132a39;
  uStack_3188 = bson_new();
  pcStack_31f0 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_31e8 = pvStack_31f8;
  pcStack_31e0 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_31d0 = "{ \"quote\": \"\\\"\"}";
  pcStack_31c0 = "{ \"backslash\": \"\\\\\"}";
  pcStack_31b0 = "{ \"\": \"\"}";
  pcStack_31a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_3190 = "{ \"nil\": \"\\u0000\"}";
  pcStack_3208 = (code *)0x132ad6;
  pvStack_31d8 = pvVar10;
  puStack_31c8 = __n;
  puStack_31b8 = puVar13;
  uStack_31a8 = uVar9;
  uStack_3198 = uVar5;
  bson_append_utf8(uStack_3188,"nil",0xffffffff,"",1);
  pvVar11 = (void *)0x8;
  while( true ) {
    pcStack_3208 = (code *)0x132b00;
    cVar1 = bson_init_from_json(auStack_3180,*(undefined8 *)((long)&pvStack_31f8 + (long)pvVar11),
                                0xffffffffffffffff,auStack_30b8);
    puVar15 = auStack_3180;
    pvVar12 = pvVar11;
    if (cVar1 == '\0') break;
    pcStack_3208 = (code *)0x132b13;
    pvStack_31f8 = (void *)bson_get_data(auStack_3180);
    puVar15 = *(undefined1 **)((long)&pcStack_31f0 + (long)pvVar11);
    pcStack_3208 = (code *)0x132b25;
    pvVar12 = (void *)bson_get_data(puVar15);
    if (*(uint *)(puVar15 + 4) != uStack_317c) {
LAB_00132b9a:
      puVar13 = auStack_3180;
      pcStack_3208 = (code *)0x132bac;
      __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
      pcStack_3208 = (code *)0x132bb9;
      uVar5 = bson_as_canonical_extended_json(puVar15);
      pvVar10 = pvStack_31f8;
      uVar3 = *(uint *)(puVar15 + 4);
      if (uStack_317c == 0) goto LAB_00132be8;
      uVar21 = 0;
      goto LAB_00132bcf;
    }
    pcStack_3208 = (code *)0x132b3c;
    puVar13 = (undefined1 *)bson_get_data(puVar15);
    pcStack_3208 = (code *)0x132b47;
    pvVar10 = (void *)bson_get_data(auStack_3180);
    pcStack_3208 = (code *)0x132b55;
    iVar2 = bcmp(puVar13,pvVar10,(ulong)*(uint *)(puVar15 + 4));
    if (iVar2 != 0) goto LAB_00132b9a;
    pcStack_3208 = (code *)0x132b64;
    bson_destroy(auStack_3180);
    pvVar11 = (void *)((long)pvVar11 + 0x10);
    __n = auStack_3180;
    pvVar10 = pvVar12;
    if (pvVar11 == (void *)0x78) {
      lVar7 = 8;
      do {
        pcStack_3208 = (code *)0x132b81;
        bson_destroy(*(undefined8 *)((long)&pcStack_31f0 + lVar7));
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x78);
      return;
    }
  }
  goto LAB_00132cac;
  while( true ) {
    if (*(char *)((long)pvStack_31f8 + uVar21) != *(char *)((long)pvVar12 + uVar21))
    goto LAB_00132c91;
    uVar21 = uVar21 + 1;
    if (uStack_317c == (uint)uVar21) break;
LAB_00132bcf:
    if (uVar3 == (uint)uVar21) break;
  }
LAB_00132be8:
  uVar4 = uStack_317c;
  if (uStack_317c < uVar3) {
    uVar4 = uVar3;
  }
  uVar21 = (ulong)(uVar4 - 1);
  while( true ) {
    pcStack_3208 = (code *)0x132c0d;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,__n,uVar5);
    pcStack_3208 = (code *)0x132c25;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    pcStack_3208 = (code *)0x132c40;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_31fc = uVar3;
    if (uVar3 == 0xffffffff) break;
    puVar13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00132c9d;
    __n = (undefined1 *)(ulong)uStack_317c;
    pcStack_3208 = (code *)0x132c6a;
    puVar14 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
    if (puVar14 != __n) goto LAB_00132ca2;
    puVar15 = (undefined1 *)(ulong)*(uint *)(puVar15 + 4);
    pcStack_3208 = (code *)0x132c80;
    puVar14 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar15);
    if (puVar14 != puVar15) goto LAB_00132ca7;
    uVar21 = (ulong)uVar4;
    pcStack_3208 = (code *)0x132c91;
    test_bson_json_uescape_cold_4();
    uVar5 = extraout_RAX_01;
LAB_00132c91:
    uVar21 = uVar21 & 0xffffffff;
  }
  pcStack_3208 = (code *)0x132c9d;
  test_bson_json_uescape_cold_6();
LAB_00132c9d:
  pcStack_3208 = (code *)0x132ca2;
  test_bson_json_uescape_cold_5();
LAB_00132ca2:
  pcStack_3208 = (code *)0x132ca7;
  test_bson_json_uescape_cold_2();
LAB_00132ca7:
  pcStack_3208 = (code *)0x132cac;
  test_bson_json_uescape_cold_3();
LAB_00132cac:
  pcStack_3208 = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_3608[0] = (code *)0x132cd6;
  puStack_3230 = puVar15;
  puStack_3228 = __n;
  puStack_3220 = puVar13;
  pvStack_3218 = pvVar12;
  pvStack_3210 = pvVar10;
  pcStack_3208 = (code *)apcStack_2e08;
  uVar5 = bson_bcon_magic();
  apcStack_3608[0] = (code *)0x132cf5;
  pcVar19 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_3608[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(auStack_3580,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_34b8);
  if (cVar1 == '\0') {
    apcStack_3608[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_3608[0] = (code *)0x132d33;
    pvVar10 = (void *)bson_get_data(auStack_3580);
    apcStack_3608[0] = (code *)0x132d3e;
    pvVar12 = (void *)bson_get_data(pcVar19);
    if (*(uint *)(pcVar19 + 4) == uStack_357c) {
      apcStack_3608[0] = (code *)0x132d53;
      pvVar11 = (void *)bson_get_data(pcVar19);
      apcStack_3608[0] = (code *)0x132d63;
      __s2 = (void *)bson_get_data(auStack_3580);
      apcStack_3608[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar11,__s2,(ulong)*(uint *)(pcVar19 + 4));
      if (iVar2 == 0) {
        apcStack_3608[0] = (code *)0x132d82;
        bson_destroy(auStack_3580);
        apcStack_3608[0] = (code *)0x132d8a;
        bson_destroy(pcVar19);
        return;
      }
    }
    puVar13 = auStack_3580;
    apcStack_3608[0] = (code *)0x132dab;
    __n = (undefined1 *)bson_as_canonical_extended_json(puVar13);
    apcStack_3608[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar19);
    uVar3 = *(uint *)(pcVar19 + 4);
    if (uStack_357c != 0) {
      uVar21 = 0;
      do {
        if (uVar3 == (uint)uVar21) break;
        if (*(char *)((long)pvVar10 + uVar21) != *(char *)((long)pvVar12 + uVar21))
        goto LAB_00132e88;
        uVar21 = uVar21 + 1;
      } while (uStack_357c != (uint)uVar21);
    }
    uVar4 = uStack_357c;
    if (uStack_357c < uVar3) {
      uVar4 = uVar3;
    }
    uVar21 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_3608[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,__n,uVar5);
      apcStack_3608[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      __n = (undefined1 *)(ulong)uVar3;
      apcStack_3608[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_3584 = uVar3;
      if (uVar3 == 0xffffffff) break;
      puVar13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      __n = (undefined1 *)(ulong)uStack_357c;
      apcStack_3608[0] = (code *)0x132e61;
      puVar15 = (undefined1 *)write(uVar3,pvVar10,(size_t)__n);
      if (puVar15 != __n) goto LAB_00132e9e;
      pcVar19 = (char *)(ulong)*(uint *)(pcVar19 + 4);
      apcStack_3608[0] = (code *)0x132e77;
      pcVar20 = (char *)write(uVar4,pvVar12,(size_t)pcVar19);
      if (pcVar20 != pcVar19) goto LAB_00132ea3;
      uVar21 = (ulong)uVar4;
      apcStack_3608[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX_02;
LAB_00132e88:
      uVar21 = uVar21 & 0xffffffff;
    }
  }
  apcStack_3608[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_3608[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_3608[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_3608[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_3988 = (code *)0x132ed6;
  pcStack_3610 = pcVar19;
  apcStack_3608[0] = (code *)&pcStack_3208;
  cVar1 = bson_init_from_json(auStack_3980,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_3898);
  if (cVar1 == '\0') {
    if (iStack_3898 != 1) goto LAB_00132f22;
    if (iStack_3894 != 1) goto LAB_00132f27;
    pcVar19 = acStack_3890;
    pcStack_3988 = (code *)0x132f09;
    pcVar20 = strstr(pcVar19,"UESCAPE_TOOSHORT");
    if (pcVar20 != (char *)0x0) {
      pcStack_3988 = (code *)0x132f16;
      bson_destroy(auStack_3980);
      return;
    }
  }
  else {
    pcStack_3988 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_3988 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_3988 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_3988 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_3d88 = (code *)0x132f67;
  pcStack_3990 = pcVar19;
  pcStack_3988 = (code *)apcStack_3608;
  cVar1 = bson_init_from_json(acStack_3d00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_3c18);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_3d88 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_3d88 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_3d88 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_3d88 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_3d80,acStack_3d00,"x");
    if (cVar1 == '\0') {
      pcStack_3d88 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_3d88 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_3d88 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_3d88 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_3d88 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_3d88 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_3d88 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_3d88 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_3d88 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_3d80);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_3d88 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_3d80);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar19 = acStack_3d00;
    pcStack_3d88 = (code *)0x132fc2;
    bson_destroy(pcVar19);
    pcStack_3d88 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_3c18);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_3d88 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_3d80,acStack_3d00,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_3d88 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_3d80);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_3d88 = (code *)0x133020;
    bson_iter_int32(auStack_3d80);
  }
  pcStack_3d88 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_3d88 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_3d88 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_3d88 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_3d88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_4188 = (code *)0x1331e2;
  pcStack_3d98 = pcVar19;
  pvStack_3d90 = pvVar12;
  pcStack_3d88 = (code *)&pcStack_3988;
  cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_4020);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_4188 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_4188 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_4188 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_4188 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_4188 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_4188 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_4188 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_4188 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_4188 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_4188 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_4188 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_4188 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_4188 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_4188 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_4188 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_4188 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_4180,acStack_4100,"x");
    if (cVar1 == '\0') {
      pcStack_4188 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_4188 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_4188 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_4188 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_4188 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_4188 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_4188 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_4188 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_4188 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_4180);
    if (iVar2 != 0x12) goto LAB_00133458;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_4188 = (code *)0x13322c;
    lVar7 = bson_iter_int64(auStack_4180);
    if (lVar7 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar19 = acStack_4100;
    pcStack_4188 = (code *)0x133245;
    bson_destroy(pcVar19);
    pcStack_4188 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_4188 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_4180,acStack_4100,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_4188 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_4180);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_4188 = (code *)0x1332a3;
    lVar7 = bson_iter_int64(auStack_4180);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar7 != -0x8000000000000000) goto LAB_0013349d;
    pcVar19 = acStack_4100;
    pcStack_4188 = (code *)0x1332bf;
    bson_destroy(pcVar19);
    pcStack_4188 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_4020 != 1) goto LAB_001334a5;
    if (iStack_401c != 2) goto LAB_001334aa;
    pcVar19 = acStack_4018;
    pcStack_4188 = (code *)0x13331c;
    pcVar20 = strstr(pcVar19,"Number \"9223372036854775808\" is out of range");
    if (pcVar20 == (char *)0x0) goto LAB_001334af;
    pcStack_4188 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_4020 != 1) goto LAB_001334b7;
    if (iStack_401c != 2) goto LAB_001334bc;
    pcStack_4188 = (code *)0x13337f;
    pcVar20 = strstr(pcVar19,"Number \"-9223372036854775809\" is out of range");
    if (pcVar20 == (char *)0x0) goto LAB_001334c1;
    pcStack_4188 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_4020 != 1) goto LAB_001334c9;
    if (iStack_401c != 2) goto LAB_001334ce;
    pcStack_4188 = (code *)0x1333e2;
    pcVar20 = strstr(pcVar19,"Number \"10000000000000000000\" is out of range");
    if (pcVar20 == (char *)0x0) goto LAB_001334d3;
    pcStack_4188 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_4100,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_4020);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_4020 != 1) goto LAB_001334db;
    if (iStack_401c != 2) goto LAB_001334e0;
    pcStack_4188 = (code *)0x133441;
    pcVar20 = strstr(pcVar19,"Number \"-10000000000000000000\" is out of range");
    if (pcVar20 != (char *)0x0) {
      return;
    }
  }
  pcStack_4188 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_4588 = (code *)0x133520;
  pcStack_4190 = pcVar19;
  pcStack_4188 = (code *)&pcStack_3d88;
  cVar1 = bson_init_from_json(acStack_4500,"{ \"x\": 1 }",0xffffffffffffffff,auStack_4418);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_4588 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_4588 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_4588 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_4588 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_4588 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_4588 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_4588 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_4588 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_4588 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_4588 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') {
      pcStack_4588 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_4588 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_4588 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_4588 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_4588 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_4588 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_4588 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_4588 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_4588 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_4588 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_4588 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_4588 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_4588 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_4580);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar19 = acStack_4500;
    pcStack_4588 = (code *)0x133579;
    bson_destroy(pcVar19);
    pcStack_4588 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_4588 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_4588 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_4588 = (code *)0x1335d7;
    lVar7 = bson_iter_int64(auStack_4580);
    if (lVar7 != 0x100000000) goto LAB_001337e7;
    pcVar19 = acStack_4500;
    pcStack_4588 = (code *)0x1335fa;
    bson_destroy(pcVar19);
    pcStack_4588 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_4588 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_4588 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_4588 = (code *)0x133658;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 != 1.0) || (NAN(dVar32))) goto LAB_001337fc;
    pcVar19 = acStack_4500;
    pcStack_4588 = (code *)0x13367c;
    bson_destroy(pcVar19);
    pcStack_4588 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_4588 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_4588 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_4588 = (code *)0x1336da;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 != 0.0) || (NAN(dVar32))) goto LAB_00133811;
    pcVar19 = acStack_4500;
    pcStack_4588 = (code *)0x1336fe;
    bson_destroy(pcVar19);
    pcStack_4588 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar19,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_4418);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_4588 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_4580,acStack_4500,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_4588 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_4580);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_4588 = (code *)0x133754;
    dVar32 = (double)bson_iter_double(auStack_4580);
    if ((dVar32 == 0.0) && (!NAN(dVar32))) {
      pcStack_4588 = (code *)0x133770;
      bson_iter_double(auStack_4580);
      if (extraout_XMM0_Db < 0) {
        pcStack_4588 = (code *)0x133787;
        bson_destroy(acStack_4500);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_4588 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar20 = "2e400";
  ppuVar26 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_45b0 = pcVar19;
  puStack_45a8 = __n;
  puStack_45a0 = puVar13;
  pvStack_4598 = pvVar12;
  pvStack_4590 = pvVar10;
  pcStack_4588 = (code *)&pcStack_4188;
  while( true ) {
    pcStack_4908 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar20);
    pcStack_4908 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_4700,uVar5,0xffffffffffffffff,&iStack_4900);
    if (cVar1 != '\0') break;
    if (iStack_4900 != 1) goto LAB_00133953;
    if (iStack_48fc != 2) goto LAB_0013394e;
    pcStack_4908 = (code *)0x1338b7;
    pcVar19 = strstr(acStack_48f8,"out of range");
    if (pcVar19 == (char *)0x0) goto LAB_00133958;
    pcStack_4908 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_4908 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar20);
    pcStack_4908 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_4700,uVar5,0xffffffffffffffff,&iStack_4900);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_4900 != 1) goto LAB_00133967;
    if (iStack_48fc != 2) goto LAB_00133962;
    pcStack_4908 = (code *)0x133918;
    pcVar19 = strstr(acStack_48f8,"out of range");
    if (pcVar19 == (char *)0x0) goto LAB_0013396c;
    pcStack_4908 = (code *)0x133925;
    bson_free(uVar5);
    pcVar20 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
    if (pcVar20 == (char *)0x0) {
      return;
    }
  }
  pcStack_4908 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_4908 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_4908 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_4908 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_4908 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_4908 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_4908 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_4908 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_4920 = "out of range";
  pcVar8 = "{ \"d\": NaN }";
  ppuVar23 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_4c80;
  piVar30 = &iStack_4bb8;
  piVar31 = (int *)0x14c766;
  pcVar19 = (char *)&dStack_4c88;
  uStack_4930 = uVar5;
  puStack_4928 = (undefined1 *)&iStack_4900;
  pcStack_4918 = pcVar20;
  ppuStack_4910 = ppuVar26;
  pcStack_4908 = (code *)&pcStack_4588;
  do {
    apcStack_4d08[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar8,0xffffffffffffffff,piVar30);
    if (cVar1 == '\0') {
      apcStack_4d08[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_4d08[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_4d08[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_4d08[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_4d08[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar19,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_4c88) && !NAN(dStack_4c88)) goto LAB_00133b30;
    apcStack_4d08[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar8 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar20 = "{ \"d\": NaNn }";
  ppuVar23 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_4bb0;
  piVar30 = aiStack_4c80;
  piVar31 = &iStack_4bb8;
  pcVar19 = "Got parse error at";
  do {
    apcStack_4d08[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar30,pcVar20,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_4bb8 != 1) goto LAB_00133b4c;
    if (iStack_4bb4 != 1) goto LAB_00133b3f;
    apcStack_4d08[0] = (code *)0x133a91;
    pcVar20 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar20 == (char *)0x0) goto LAB_00133b44;
    pcVar20 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar20 != (char *)0x0);
  pcVar20 = "{ \"d\": nu";
  ppuVar23 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar30 = aiStack_4c80;
  piVar31 = &iStack_4bb8;
  pcVar19 = "Incomplete JSON";
  while( true ) {
    apcStack_4d08[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar30,pcVar20,0xffffffffffffffff,piVar31);
    if (cVar1 != '\0') break;
    if (iStack_4bb8 != 1) goto LAB_00133b5e;
    if (iStack_4bb4 != 1) goto LAB_00133b51;
    apcStack_4d08[0] = (code *)0x133b05;
    pcVar20 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar20 == (char *)0x0) goto LAB_00133b56;
    pcVar20 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar20 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_4d08[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_4d08[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_4d08[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_4d08[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_4d08[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_4d08[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_4d08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar20 = "{ \"d\": Infinity }";
  ppuVar26 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_4d30 = __haystack;
  pdStack_4d28 = (double *)pcVar19;
  ppuStack_4d20 = ppuVar23;
  piStack_4d18 = piVar30;
  piStack_4d10 = piVar31;
  apcStack_4d08[0] = (code *)&pcStack_4908;
  do {
    apcStack_5108[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_5080,pcVar20,0xffffffffffffffff,&iStack_4fb8);
    if (cVar1 == '\0') {
      apcStack_5108[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_5108[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_5108[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_5108[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_5108[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_5080,"d",__haystack,1,&puStack_5088,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_5088)) ||
       (!NAN((double)puStack_5088 - (double)puStack_5088) &&
        !NAN((double)puStack_5088 - (double)puStack_5088))) goto LAB_00133dda;
    apcStack_5108[0] = (code *)0x133c0d;
    bson_destroy(auStack_5080);
    pcVar20 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar20 != (char *)0x0);
  pcVar19 = "{ \"d\": -Infinity }";
  ppuVar26 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_5108[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_5080,pcVar19,0xffffffffffffffff,&iStack_4fb8);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_5108[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_5080,"d",__haystack,1,&puStack_5088,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_5088)) || (!NAN((double)puStack_5088 - (double)puStack_5088)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_5088) goto LAB_00133dee;
    apcStack_5108[0] = (code *)0x133cb5;
    bson_destroy(auStack_5080);
    pcVar19 = *ppuVar26;
    ppuVar26 = ppuVar26 + 1;
  } while (pcVar19 != (char *)0x0);
  pcVar20 = "{ \"d\": Infinityy }";
  ppuVar23 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_4fb0;
  ppuVar26 = (undefined **)&iStack_4fb8;
  pcVar19 = "Got parse error at";
  do {
    apcStack_5108[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_5080,pcVar20,0xffffffffffffffff,ppuVar26);
    if (cVar1 != '\0') goto LAB_00133df3;
    if (iStack_4fb8 != 1) goto LAB_00133e0a;
    if (iStack_4fb4 != 1) goto LAB_00133dfd;
    apcStack_5108[0] = (code *)0x133d37;
    pcVar20 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar20 == (char *)0x0) goto LAB_00133e02;
    pcVar20 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar20 != (char *)0x0);
  pcVar20 = "{ \"d\": In";
  ppuVar23 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar26 = (undefined **)&iStack_4fb8;
  pcVar19 = "Incomplete JSON";
  while( true ) {
    apcStack_5108[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_5080,pcVar20,0xffffffffffffffff,ppuVar26);
    if (cVar1 != '\0') break;
    if (iStack_4fb8 != 1) goto LAB_00133e1c;
    if (iStack_4fb4 != 1) goto LAB_00133e0f;
    apcStack_5108[0] = (code *)0x133daf;
    pcVar20 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar20 == (char *)0x0) goto LAB_00133e14;
    pcVar20 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar20 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_5108[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_5108[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_5108[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_5108[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_5108[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_5108[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  puVar13 = auStack_5080;
  apcStack_5108[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_5488 = (code *)0x133e4e;
  apcStack_5108[0] = (code *)apcStack_4d08;
  cVar1 = bson_init_from_json(auStack_5480,"{ \"x\": null }",0xffffffffffffffff,auStack_5390);
  if (cVar1 == '\0') {
    pcStack_5488 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_5488 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_5488 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_5480,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_5488 = (code *)0x133e7f;
      bson_destroy(auStack_5480);
      return;
    }
  }
  pcStack_5488 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_5888 = (code *)0x0;
  pcStack_5890 = "}";
  acStack_58a0[8] = -0x2e;
  acStack_58a0[9] = '>';
  acStack_58a0[10] = '\x13';
  acStack_58a0[0xb] = '\0';
  acStack_58a0[0xc] = '\0';
  acStack_58a0[0xd] = '\0';
  acStack_58a0[0xe] = '\0';
  acStack_58a0[0xf] = '\0';
  piStack_54b0 = __haystack;
  pcStack_54a8 = pcVar19;
  ppuStack_54a0 = ppuVar23;
  puStack_5498 = puVar13;
  ppuStack_5490 = ppuVar26;
  pcStack_5488 = (code *)apcStack_5108;
  uVar21 = bcon_new(0,"a","{","b","{");
  uStack_5790 = 0;
  uStack_5788 = 0;
  uStack_57a0 = 0;
  uStack_5798 = 0;
  uStack_57b0 = 0;
  uStack_57a8 = 0;
  uStack_57c0 = 0;
  uStack_57b8 = 0;
  uStack_57d0 = 0;
  uStack_57c8 = 0;
  uStack_57e0 = 0;
  uStack_57d8 = 0;
  uStack_57f0 = 0;
  uStack_57e8 = 0;
  uStack_5800 = (undefined *)0x500000003;
  uStack_57f8 = 5;
  pcStack_5888 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_5800,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_5738);
  if (cVar1 != '\0') {
    pcStack_5888 = (code *)0x133f47;
    ppuVar26 = (undefined **)bson_get_data(&uStack_5800);
    pcStack_5888 = (code *)0x133f52;
    puVar13 = (undefined1 *)bson_get_data(uVar21);
    if (*(int *)(uVar21 + 4) == uStack_5800._4_4_) {
      pcStack_5888 = (code *)0x133f67;
      pvVar10 = (void *)bson_get_data(uVar21);
      pcStack_5888 = (code *)0x133f77;
      pvVar11 = (void *)bson_get_data(&uStack_5800);
      pcStack_5888 = (code *)0x133f85;
      iVar2 = bcmp(pvVar10,pvVar11,(ulong)*(uint *)(uVar21 + 4));
      if (iVar2 == 0) {
        pcStack_5888 = (code *)0x133f96;
        bson_destroy(&uStack_5800);
        pcStack_5888 = (code *)0x133f9e;
        bson_destroy(uVar21);
        return;
      }
    }
    ppuVar23 = (undefined **)&uStack_5800;
    pcStack_5888 = (code *)0x133fbf;
    pcVar19 = (char *)bson_as_canonical_extended_json(ppuVar23);
    pcStack_5888 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar21);
    uVar3 = *(uint *)(uVar21 + 4);
    if (uStack_5800._4_4_ != 0) {
      uVar22 = 0;
      do {
        if (uVar3 == (uint)uVar22) break;
        if (*(char *)((long)ppuVar26 + uVar22) != puVar13[uVar22]) goto LAB_0013409c;
        uVar22 = uVar22 + 1;
      } while (uStack_5800._4_4_ != (uint)uVar22);
    }
    uVar4 = uStack_5800._4_4_;
    if (uStack_5800._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar22 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_5888 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar22,pcVar19,uVar5);
      pcStack_5888 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar19 = (char *)(ulong)uVar3;
      pcStack_5888 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_5804 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar23 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar19 = (char *)((ulong)uStack_5800 >> 0x20);
      pcStack_5888 = (code *)0x134075;
      pcVar20 = (char *)write(uVar3,ppuVar26,(size_t)pcVar19);
      if (pcVar20 != pcVar19) goto LAB_001340ad;
      uVar21 = (ulong)*(uint *)(uVar21 + 4);
      pcStack_5888 = (code *)0x13408b;
      uVar22 = write(uVar4,puVar13,uVar21);
      if (uVar22 != uVar21) goto LAB_001340b2;
      uVar22 = (ulong)uVar4;
      pcStack_5888 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_03;
LAB_0013409c:
      uVar22 = uVar22 & 0xffffffff;
    }
    pcStack_5888 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_5888 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_5888 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_5888 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_5888 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar20 = acStack_58a0;
  acStack_58a0[8] = '\0';
  acStack_58a0[9] = '\0';
  acStack_58a0[10] = '\0';
  acStack_58a0[0xb] = '\0';
  acStack_58a0[0xc] = '\0';
  acStack_58a0[0xd] = '\0';
  acStack_58a0[0xe] = '@';
  acStack_58a0[0xf] = '0';
  acStack_58a0[0] = '\v';
  acStack_58a0[1] = '\0';
  acStack_58a0[2] = '\0';
  acStack_58a0[3] = '\0';
  acStack_58a0[4] = '\0';
  acStack_58a0[5] = '\0';
  acStack_58a0[6] = '\0';
  acStack_58a0[7] = '\0';
  pcStack_58b0 = (code *)0x1340ea;
  pcStack_5890 = (char *)uVar21;
  pcStack_5888 = (code *)puVar13;
  plVar16 = (long *)bson_new();
  pcStack_58b0 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar16,"decimal128",0xffffffff,pcVar20);
  if (cVar1 == '\0') {
    pcStack_58b0 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_58b0 = (code *)0x134113;
    pcVar20 = (char *)bson_as_json(plVar16,auStack_58a8);
    if (pcVar20 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_58b0 = (code *)0x13413d;
      bson_free(pcVar20);
      pcStack_58b0 = (code *)0x134145;
      bson_destroy(plVar16);
      return;
    }
    pcStack_58b0 = (code *)0x134131;
    iVar2 = strcmp(pcVar20,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_58b0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar33 = &pcStack_58b0;
  ppuStack_5d08 = (undefined **)0x13418d;
  plStack_58b8 = plVar16;
  pcStack_58b0 = (code *)&pcStack_5488;
  cVar1 = bson_init_from_json(auStack_5c00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_5b18);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_5d08 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_5c80,auStack_5c00);
  if (cVar1 == '\0') {
    ppuStack_5d08 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_5d08 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_5d08 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_5d08 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_5d08 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_5c80,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_5d08 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_5c80);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar16 = &lStack_5c90;
    ppuStack_5d08 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_5c80,plVar16);
    if (lStack_5c90 != 0xb) goto LAB_00134227;
    if (lStack_5c88 == 0x3040000000000000) {
      ppuStack_5d08 = (undefined **)0x134211;
      bson_destroy(auStack_5c00);
      return;
    }
  }
  ppuStack_5d08 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_5d08 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar8 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar25 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_5d20 = plVar16;
  pcStack_5d18 = pcVar19;
  pcStack_5d10 = pcVar20;
  ppuStack_5d08 = ppuVar26;
  do {
    pcStack_5f30 = (code *)0x134273;
    lVar7 = bson_new_from_json(pcVar8,0xffffffffffffffff,&iStack_5f20);
    if (lVar7 != 0) {
      pcStack_5f30 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_5f30 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_5f18,
              ppuVar26);
      pcStack_5f30 = (code *)0x1342e3;
      abort();
    }
    if (iStack_5f20 != 1) {
LAB_001342e8:
      pcStack_5f30 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_6148 = (code *)0x13430d;
      pcStack_5f38 = acStack_5f18;
      pcStack_5f30 = (code *)&iStack_5f20;
      pcVar19 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_6138);
      pcStack_6148 = (code *)0x13431a;
      pcVar20 = (char *)bson_as_json(pcVar19,0);
      if (pcVar20 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_6148 = (code *)0x134344;
        bson_free(pcVar20);
        pcStack_6148 = (code *)0x13434c;
        bson_destroy(pcVar19);
        return;
      }
      pcStack_6148 = (code *)0x134338;
      iVar2 = strcmp(pcVar20,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_6148 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_6358 = 0x2200223a2261227b;
      uStack_6350 = 0x7d;
      uStack_635c = 0x227b;
      pcStack_6148 = (code *)pcVar19;
      lVar7 = bson_new_from_json(&uStack_6358,9,&iStack_6348);
      if (lVar7 == 0) {
        if (iStack_6348 != 1) goto LAB_00134418;
        if (iStack_6344 != 1) goto LAB_0013441d;
        pcVar19 = acStack_6340;
        pcVar8 = strstr(pcVar19,"Got parse error");
        if (pcVar8 == (char *)0x0) goto LAB_00134422;
        lVar7 = bson_new_from_json(&uStack_635c,3,&iStack_6348);
        if (lVar7 != 0) goto LAB_00134413;
        if (iStack_6348 != 1) goto LAB_0013442a;
        if (iStack_6344 == 1) {
          pcVar8 = strstr(pcVar19,"Got parse error");
          if (pcVar8 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_04;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0,uVar5,pcVar19,ppuVar25,ppuVar23,pcVar20,ppuVar26,ppcVar33
                      );
      uVar17 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar17,0);
      uVar5 = bson_new();
      uVar17 = bson_new();
      uVar18 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar17,uVar18,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_5f1c != 2) {
      pcStack_5f30 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar26 = (undefined **)ppuVar25[-1];
    pcStack_5f30 = (code *)0x13429a;
    pcVar19 = strstr(acStack_5f18,(char *)ppuVar26);
    if (pcVar19 == (char *)0x0) goto LAB_001342c0;
    pcVar8 = *ppuVar25;
    ppuVar25 = ppuVar25 + 2;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_4d08[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_5108[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_5108[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_5108[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar23 = &puStack_5088;
  pcVar19 = "d";
  apcStack_5108[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_5108[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_read_dbpointer (void)
{
   bson_t b;
   bson_error_t error;
   bool r;

   /* must have both $ref and $id, $id must be ObjectId */
   const char *invalid[] = {
      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\"}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {\"$ref\": \"db.collection\", \"$id\": 1}}",
      "$dbPointer.$id must be like {\"$oid\": ...\"}",

      "{\"p\": {\"$dbPointer\": {\"$id\": {"
      "\"$oid\": \"57e193d7a9cc81b4027498b1\"}}}}",
      "$dbPointer requires both $id and $ref",

      "{\"p\": {\"$dbPointer\": {}}}",
      "Empty $dbPointer",

      NULL};

   const char **p;

   for (p = invalid; *p; p += 2) {
      r = bson_init_from_json (&b, *p, -1, &error);
      BSON_ASSERT (!r);
      ASSERT_ERROR_CONTAINS (
         error, BSON_ERROR_JSON, BSON_JSON_ERROR_READ_INVALID_PARAM, *(p + 1));

      bson_destroy (&b);
   }
}